

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar76;
  undefined1 auVar75 [32];
  undefined1 in_ZMM10 [64];
  float in_register_000014dc;
  float fVar77;
  undefined1 in_ZMM12 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar54 = sVar8 * uVar5;
  auVar57 = *(undefined1 (*) [16])(pcVar7 + lVar54);
  lVar53 = sVar8 * (uVar5 + 1);
  auVar4 = *(undefined1 (*) [16])(pcVar7 + lVar53);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar50 = uVar5 * sVar8;
  lVar55 = sVar8 * (uVar5 + 1);
  fVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar10 = fVar3 * *(float *)(pcVar7 + lVar54 + 0xc);
  auVar61 = vinsertps_avx(auVar57,ZEXT416((uint)fVar10),0x30);
  fVar11 = fVar3 * *(float *)(pcVar7 + lVar53 + 0xc);
  auVar56 = vinsertps_avx(auVar4,ZEXT416((uint)fVar11),0x30);
  auVar64 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + lVar50),
                          ZEXT416((uint)(fVar3 * *(float *)(pcVar9 + lVar50 + 0xc))),0x30);
  auVar59 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + lVar55),
                          ZEXT416((uint)(fVar3 * *(float *)(pcVar9 + lVar55 + 0xc))),0x30);
  auVar68._0_4_ = auVar61._0_4_ + auVar64._0_4_ * 0.33333334;
  auVar68._4_4_ = auVar61._4_4_ + auVar64._4_4_ * 0.33333334;
  auVar68._8_4_ = auVar61._8_4_ + auVar64._8_4_ * 0.33333334;
  auVar68._12_4_ = auVar61._12_4_ + auVar64._12_4_ * 0.33333334;
  auVar61._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar61._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar61._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar61._12_4_ = auVar59._12_4_ * 0.33333334;
  auVar61 = vsubps_avx(auVar56,auVar61);
  uVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar51 = (ulong)uVar5;
  auVar59 = ZEXT416((uint)fVar10);
  auVar64 = ZEXT416((uint)fVar11);
  if (uVar51 == 4) {
    auVar14 = vshufps_avx(auVar4,auVar4,0);
    auVar58 = vshufps_avx(auVar4,auVar4,0x55);
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar15 = vshufps_avx(auVar64,auVar64,0);
    auVar66 = vshufps_avx(auVar61,auVar61,0);
    auVar16 = vshufps_avx(auVar61,auVar61,0x55);
    auVar17 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar61 = vshufps_avx(auVar61,auVar61,0xff);
    auVar71 = vshufps_avx(auVar68,auVar68,0);
    auVar18 = vshufps_avx(auVar68,auVar68,0x55);
    auVar19 = vshufps_avx(auVar68,auVar68,0xaa);
    auVar20 = vshufps_avx(auVar57,auVar57,0);
    auVar68 = vshufps_avx(auVar68,auVar68,0xff);
    auVar21 = vshufps_avx(auVar57,auVar57,0x55);
    auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
    auVar59 = vshufps_avx(auVar59,auVar59,0);
    auVar69._0_4_ =
         auVar71._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar66._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar14._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar20._0_4_ * (float)bezier_basis0._272_4_;
    auVar69._4_4_ =
         auVar71._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar66._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar14._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar20._4_4_ * (float)bezier_basis0._276_4_;
    auVar69._8_4_ =
         auVar71._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar66._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar14._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar20._8_4_ * (float)bezier_basis0._280_4_;
    auVar69._12_4_ =
         auVar71._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar66._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar14._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar20._12_4_ * (float)bezier_basis0._284_4_;
    auVar71._0_4_ =
         auVar18._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar16._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar58._0_4_ * (float)bezier_basis0._3740_4_ +
         (float)bezier_basis0._272_4_ * auVar21._0_4_;
    auVar71._4_4_ =
         auVar18._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar16._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar58._4_4_ * (float)bezier_basis0._3744_4_ +
         (float)bezier_basis0._276_4_ * auVar21._4_4_;
    auVar71._8_4_ =
         auVar18._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar16._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar58._8_4_ * (float)bezier_basis0._3748_4_ +
         (float)bezier_basis0._280_4_ * auVar21._8_4_;
    auVar71._12_4_ =
         auVar18._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar16._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar58._12_4_ * (float)bezier_basis0._3752_4_ +
         (float)bezier_basis0._284_4_ * auVar21._12_4_;
    auVar58._0_4_ =
         (float)bezier_basis0._272_4_ * auVar57._0_4_ +
         auVar19._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar17._0_4_ * (float)bezier_basis0._2584_4_ +
         (float)bezier_basis0._3740_4_ * auVar4._0_4_;
    auVar58._4_4_ =
         (float)bezier_basis0._276_4_ * auVar57._4_4_ +
         auVar19._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar17._4_4_ * (float)bezier_basis0._2588_4_ +
         (float)bezier_basis0._3744_4_ * auVar4._4_4_;
    auVar58._8_4_ =
         (float)bezier_basis0._280_4_ * auVar57._8_4_ +
         auVar19._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar17._8_4_ * (float)bezier_basis0._2592_4_ +
         (float)bezier_basis0._3748_4_ * auVar4._8_4_;
    auVar58._12_4_ =
         (float)bezier_basis0._284_4_ * auVar57._12_4_ +
         auVar19._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar17._12_4_ * (float)bezier_basis0._2596_4_ +
         (float)bezier_basis0._3752_4_ * auVar4._12_4_;
    auVar66._0_4_ =
         (float)bezier_basis0._272_4_ * auVar59._0_4_ +
         auVar68._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar15._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar61._0_4_ * (float)bezier_basis0._2584_4_;
    auVar66._4_4_ =
         (float)bezier_basis0._276_4_ * auVar59._4_4_ +
         auVar68._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar15._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar61._4_4_ * (float)bezier_basis0._2588_4_;
    auVar66._8_4_ =
         (float)bezier_basis0._280_4_ * auVar59._8_4_ +
         auVar68._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar15._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar61._8_4_ * (float)bezier_basis0._2592_4_;
    auVar66._12_4_ =
         (float)bezier_basis0._284_4_ * auVar59._12_4_ +
         auVar68._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar15._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar61._12_4_ * (float)bezier_basis0._2596_4_;
    auVar59 = vshufps_avx(auVar69,auVar69,0xb1);
    auVar57 = vminps_avx(auVar59,auVar69);
    auVar4 = vshufpd_avx(auVar57,auVar57,1);
    auVar57 = vminps_avx(auVar4,auVar57);
    auVar68 = vshufps_avx(auVar71,auVar71,0xb1);
    auVar4 = vminps_avx(auVar68,auVar71);
    auVar61 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vminps_avx(auVar61,auVar4);
    auVar57 = vinsertps_avx(auVar57,auVar4,0x1c);
    auVar14 = vshufps_avx(auVar58,auVar58,0xb1);
    auVar4 = vminps_avx(auVar14,auVar58);
    auVar61 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vminps_avx(auVar61,auVar4);
    auVar57 = vinsertps_avx(auVar57,auVar4,0x20);
    auVar4 = vmaxps_avx(auVar59,auVar69);
    auVar61 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vmaxps_avx(auVar61,auVar4);
    auVar61 = vmaxps_avx(auVar68,auVar71);
    auVar59 = vshufpd_avx(auVar61,auVar61,1);
    auVar61 = vmaxps_avx(auVar59,auVar61);
    auVar4 = vinsertps_avx(auVar4,auVar61,0x1c);
    auVar61 = vmaxps_avx(auVar14,auVar58);
    auVar59 = vshufpd_avx(auVar61,auVar61,1);
    auVar61 = vmaxps_avx(auVar59,auVar61);
    auVar4 = vinsertps_avx(auVar4,auVar61,0x20);
    auVar59._8_4_ = 0x7fffffff;
    auVar59._0_8_ = 0x7fffffff7fffffff;
    auVar59._12_4_ = 0x7fffffff;
    auVar61 = vandps_avx(auVar66,auVar59);
    auVar59 = vshufps_avx(auVar61,auVar61,0xb1);
    auVar61 = vmaxps_avx(auVar59,auVar61);
    auVar59 = vshufps_avx(auVar61,auVar61,0);
    auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar61 = vmaxps_avx(auVar61,auVar59);
  }
  else {
    if ((int)uVar5 < 1) {
      auVar79._8_4_ = 0x7f800000;
      auVar79._0_8_ = 0x7f8000007f800000;
      auVar79._12_4_ = 0x7f800000;
      auVar79._16_4_ = 0x7f800000;
      auVar79._20_4_ = 0x7f800000;
      auVar79._24_4_ = 0x7f800000;
      auVar79._28_4_ = 0x7f800000;
      auVar80._8_4_ = 0xff800000;
      auVar80._0_8_ = 0xff800000ff800000;
      auVar80._12_4_ = 0xff800000;
      auVar80._16_4_ = 0xff800000;
      auVar80._20_4_ = 0xff800000;
      auVar80._24_4_ = 0xff800000;
      auVar80._28_4_ = 0xff800000;
      auVar63 = ZEXT832(0) << 0x20;
      auVar72 = auVar79;
      auVar65 = auVar79;
      auVar78 = auVar80;
      auVar70 = auVar80;
    }
    else {
      auVar14 = vpshufd_avx(ZEXT416(uVar5),0);
      auVar58 = vshufps_avx(auVar57,auVar57,0);
      auVar15 = vshufps_avx(auVar57,auVar57,0x55);
      auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar59 = vshufps_avx(ZEXT416((uint)fVar10),auVar59,0);
      auVar66 = vshufps_avx(auVar68,auVar68,0);
      auVar16 = vshufps_avx(auVar68,auVar68,0x55);
      auVar17 = vshufps_avx(auVar68,auVar68,0xaa);
      auVar68 = vshufps_avx(auVar68,auVar68,0xff);
      auVar71 = vshufps_avx(auVar61,auVar61,0);
      auVar18 = vshufps_avx(auVar61,auVar61,0x55);
      auVar19 = vshufps_avx(auVar61,auVar61,0xaa);
      auVar61 = vshufps_avx(auVar61,auVar61,0xff);
      auVar20 = vshufps_avx(auVar4,auVar4,0);
      auVar21 = vshufps_avx(auVar4,auVar4,0x55);
      auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
      auVar69 = vshufps_avx(ZEXT416((uint)fVar11),auVar64,0);
      lVar50 = uVar51 * 0x44;
      uVar52 = 0;
      auVar60 = ZEXT864(0) << 0x20;
      auVar70._8_4_ = 0xff800000;
      auVar70._0_8_ = 0xff800000ff800000;
      auVar70._12_4_ = 0xff800000;
      auVar70._16_4_ = 0xff800000;
      auVar70._20_4_ = 0xff800000;
      auVar70._24_4_ = 0xff800000;
      auVar70._28_4_ = 0xff800000;
      auVar65._8_4_ = 0x7f800000;
      auVar65._0_8_ = 0x7f8000007f800000;
      auVar65._12_4_ = 0x7f800000;
      auVar65._16_4_ = 0x7f800000;
      auVar65._20_4_ = 0x7f800000;
      auVar65._24_4_ = 0x7f800000;
      auVar65._28_4_ = 0x7f800000;
      auVar72 = auVar65;
      auVar78 = auVar70;
      auVar79 = auVar65;
      auVar80 = auVar70;
      do {
        auVar13 = vpshufd_avx(ZEXT416((uint)uVar52),0);
        auVar12 = vpor_avx(auVar13,_DAT_01f7fcf0);
        auVar13 = vpor_avx(auVar13,_DAT_01fafea0);
        auVar12 = vpcmpgtd_avx(auVar14,auVar12);
        auVar12 = vpackssdw_avx(auVar12,auVar12);
        auVar13 = vpcmpgtd_avx(auVar14,auVar13);
        auVar12 = vpunpcklwd_avx(auVar12,auVar12);
        auVar67._16_16_ = auVar13;
        auVar67._0_16_ = auVar12;
        pfVar1 = (float *)(lVar50 + 0x21aabec + uVar52 * 4);
        fVar3 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar23 = pfVar1[3];
        fVar24 = pfVar1[4];
        fVar25 = pfVar1[5];
        fVar26 = pfVar1[6];
        pfVar2 = (float *)(lVar50 + 0x21ab070 + uVar52 * 4);
        fVar27 = *pfVar2;
        fVar28 = pfVar2[1];
        fVar29 = pfVar2[2];
        fVar30 = pfVar2[3];
        fVar31 = pfVar2[4];
        fVar32 = pfVar2[5];
        fVar33 = pfVar2[6];
        fVar34 = pfVar2[7];
        local_1a8 = auVar20._0_4_;
        fStack_1a4 = auVar20._4_4_;
        fStack_1a0 = auVar20._8_4_;
        fStack_19c = auVar20._12_4_;
        local_1c8 = auVar21._0_4_;
        fStack_1c4 = auVar21._4_4_;
        fStack_1c0 = auVar21._8_4_;
        fStack_1bc = auVar21._12_4_;
        local_1e8 = auVar4._0_4_;
        fStack_1e4 = auVar4._4_4_;
        fStack_1e0 = auVar4._8_4_;
        fStack_1dc = auVar4._12_4_;
        local_128 = auVar71._0_4_;
        fStack_124 = auVar71._4_4_;
        fStack_120 = auVar71._8_4_;
        fStack_11c = auVar71._12_4_;
        local_148 = auVar18._0_4_;
        fStack_144 = auVar18._4_4_;
        fStack_140 = auVar18._8_4_;
        fStack_13c = auVar18._12_4_;
        fVar76 = in_ZMM10._28_4_ + in_register_000014dc;
        local_168 = auVar19._0_4_;
        fStack_164 = auVar19._4_4_;
        fStack_160 = auVar19._8_4_;
        fStack_15c = auVar19._12_4_;
        fVar77 = in_register_000014dc + in_ZMM12._28_4_;
        pfVar2 = (float *)(lVar50 + 0x21aa768 + uVar52 * 4);
        fVar35 = *pfVar2;
        fVar36 = pfVar2[1];
        fVar37 = pfVar2[2];
        fVar38 = pfVar2[3];
        fVar39 = pfVar2[4];
        fVar40 = pfVar2[5];
        fVar41 = pfVar2[6];
        fVar42 = pfVar2[7];
        local_208 = auVar69._0_4_;
        fStack_204 = auVar69._4_4_;
        fStack_200 = auVar69._8_4_;
        fStack_1fc = auVar69._12_4_;
        local_188 = auVar61._0_4_;
        fStack_184 = auVar61._4_4_;
        fStack_180 = auVar61._8_4_;
        fStack_17c = auVar61._12_4_;
        local_a8 = auVar66._0_4_;
        fStack_a4 = auVar66._4_4_;
        fStack_a0 = auVar66._8_4_;
        fStack_9c = auVar66._12_4_;
        local_c8 = auVar16._0_4_;
        fStack_c4 = auVar16._4_4_;
        fStack_c0 = auVar16._8_4_;
        fStack_bc = auVar16._12_4_;
        local_e8 = auVar17._0_4_;
        fStack_e4 = auVar17._4_4_;
        fStack_e0 = auVar17._8_4_;
        fStack_dc = auVar17._12_4_;
        pfVar2 = (float *)(bezier_basis0 + uVar52 * 4 + lVar50);
        fVar43 = *pfVar2;
        fVar44 = pfVar2[1];
        fVar45 = pfVar2[2];
        fVar46 = pfVar2[3];
        fVar47 = pfVar2[4];
        fVar48 = pfVar2[5];
        fVar49 = pfVar2[6];
        in_register_000014dc = pfVar2[7];
        local_108 = auVar68._0_4_;
        fStack_104 = auVar68._4_4_;
        fStack_100 = auVar68._8_4_;
        fStack_fc = auVar68._12_4_;
        local_28 = auVar58._0_4_;
        fStack_24 = auVar58._4_4_;
        fStack_20 = auVar58._8_4_;
        fStack_1c = auVar58._12_4_;
        auVar62._0_4_ =
             fVar43 * local_28 + fVar35 * local_a8 + fVar27 * local_1a8 + fVar3 * local_128;
        auVar62._4_4_ =
             fVar44 * fStack_24 + fVar36 * fStack_a4 + fVar28 * fStack_1a4 + fVar10 * fStack_124;
        auVar62._8_4_ =
             fVar45 * fStack_20 + fVar37 * fStack_a0 + fVar29 * fStack_1a0 + fVar11 * fStack_120;
        auVar62._12_4_ =
             fVar46 * fStack_1c + fVar38 * fStack_9c + fVar30 * fStack_19c + fVar23 * fStack_11c;
        auVar62._16_4_ =
             fVar47 * local_28 + fVar39 * local_a8 + fVar31 * local_1a8 + fVar24 * local_128;
        auVar62._20_4_ =
             fVar48 * fStack_24 + fVar40 * fStack_a4 + fVar32 * fStack_1a4 + fVar25 * fStack_124;
        auVar62._24_4_ =
             fVar49 * fStack_20 + fVar41 * fStack_a0 + fVar33 * fStack_1a0 + fVar26 * fStack_120;
        auVar62._28_4_ = fVar42 + fVar34 + in_ZMM10._28_4_ + 0.0;
        local_48 = auVar15._0_4_;
        fStack_44 = auVar15._4_4_;
        fStack_40 = auVar15._8_4_;
        fStack_3c = auVar15._12_4_;
        auVar74._0_4_ =
             fVar43 * local_48 + fVar35 * local_c8 + fVar3 * local_148 + fVar27 * local_1c8;
        auVar74._4_4_ =
             fVar44 * fStack_44 + fVar36 * fStack_c4 + fVar10 * fStack_144 + fVar28 * fStack_1c4;
        auVar74._8_4_ =
             fVar45 * fStack_40 + fVar37 * fStack_c0 + fVar11 * fStack_140 + fVar29 * fStack_1c0;
        auVar74._12_4_ =
             fVar46 * fStack_3c + fVar38 * fStack_bc + fVar23 * fStack_13c + fVar30 * fStack_1bc;
        auVar74._16_4_ =
             fVar47 * local_48 + fVar39 * local_c8 + fVar24 * local_148 + fVar31 * local_1c8;
        auVar74._20_4_ =
             fVar48 * fStack_44 + fVar40 * fStack_c4 + fVar25 * fStack_144 + fVar32 * fStack_1c4;
        auVar74._24_4_ =
             fVar49 * fStack_40 + fVar41 * fStack_c0 + fVar26 * fStack_140 + fVar33 * fStack_1c0;
        auVar74._28_4_ = fVar42 + fVar34 + fVar76;
        auVar63 = vminps_avx(auVar79,auVar62);
        auVar79 = vblendvps_avx(auVar79,auVar63,auVar67);
        local_68 = auVar57._0_4_;
        fStack_64 = auVar57._4_4_;
        fStack_60 = auVar57._8_4_;
        fStack_5c = auVar57._12_4_;
        auVar75._0_4_ =
             fVar43 * local_68 + fVar35 * local_e8 + fVar3 * local_168 + fVar27 * local_1e8;
        auVar75._4_4_ =
             fVar44 * fStack_64 + fVar36 * fStack_e4 + fVar10 * fStack_164 + fVar28 * fStack_1e4;
        auVar75._8_4_ =
             fVar45 * fStack_60 + fVar37 * fStack_e0 + fVar11 * fStack_160 + fVar29 * fStack_1e0;
        auVar75._12_4_ =
             fVar46 * fStack_5c + fVar38 * fStack_dc + fVar23 * fStack_15c + fVar30 * fStack_1dc;
        auVar75._16_4_ =
             fVar47 * local_68 + fVar39 * local_e8 + fVar24 * local_168 + fVar31 * local_1e8;
        auVar75._20_4_ =
             fVar48 * fStack_64 + fVar40 * fStack_e4 + fVar25 * fStack_164 + fVar32 * fStack_1e4;
        auVar75._24_4_ =
             fVar49 * fStack_60 + fVar41 * fStack_e0 + fVar26 * fStack_160 + fVar33 * fStack_1e0;
        auVar75._28_4_ = auVar63._28_4_ + fVar76 + fVar77;
        in_ZMM10 = ZEXT3264(auVar75);
        auVar63 = vminps_avx(auVar72,auVar74);
        auVar72 = vblendvps_avx(auVar72,auVar63,auVar67);
        auVar63 = vminps_avx(auVar65,auVar75);
        in_ZMM12 = ZEXT3264(auVar63);
        auVar65 = vblendvps_avx(auVar65,auVar63,auVar67);
        local_88 = auVar59._0_4_;
        fStack_84 = auVar59._4_4_;
        fStack_80 = auVar59._8_4_;
        fStack_7c = auVar59._12_4_;
        auVar73._0_4_ =
             fVar43 * local_88 + fVar35 * local_108 + fVar3 * local_188 + fVar27 * local_208;
        auVar73._4_4_ =
             fVar44 * fStack_84 + fVar36 * fStack_104 + fVar10 * fStack_184 + fVar28 * fStack_204;
        auVar73._8_4_ =
             fVar45 * fStack_80 + fVar37 * fStack_100 + fVar11 * fStack_180 + fVar29 * fStack_200;
        auVar73._12_4_ =
             fVar46 * fStack_7c + fVar38 * fStack_fc + fVar23 * fStack_17c + fVar30 * fStack_1fc;
        auVar73._16_4_ =
             fVar47 * local_88 + fVar39 * local_108 + fVar24 * local_188 + fVar31 * local_208;
        auVar73._20_4_ =
             fVar48 * fStack_84 + fVar40 * fStack_104 + fVar25 * fStack_184 + fVar32 * fStack_204;
        auVar73._24_4_ =
             fVar49 * fStack_80 + fVar41 * fStack_100 + fVar26 * fStack_180 + fVar33 * fStack_200;
        auVar73._28_4_ = in_register_000014dc + fVar42 + pfVar1[7] + fVar34;
        auVar63 = vmaxps_avx(auVar80,auVar62);
        auVar80 = vblendvps_avx(auVar80,auVar63,auVar67);
        auVar63 = vmaxps_avx(auVar78,auVar74);
        auVar78 = vblendvps_avx(auVar78,auVar63,auVar67);
        auVar63 = vmaxps_avx(auVar70,auVar75);
        auVar70 = vblendvps_avx(auVar70,auVar63,auVar67);
        auVar63._8_4_ = 0x7fffffff;
        auVar63._0_8_ = 0x7fffffff7fffffff;
        auVar63._12_4_ = 0x7fffffff;
        auVar63._16_4_ = 0x7fffffff;
        auVar63._20_4_ = 0x7fffffff;
        auVar63._24_4_ = 0x7fffffff;
        auVar63._28_4_ = 0x7fffffff;
        auVar63 = vandps_avx(auVar73,auVar63);
        auVar63 = vmaxps_avx(auVar60._0_32_,auVar63);
        auVar63 = vblendvps_avx(auVar60._0_32_,auVar63,auVar67);
        auVar60 = ZEXT3264(auVar63);
        uVar52 = uVar52 + 8;
      } while (uVar52 < uVar51);
    }
    auVar62 = vshufps_avx(auVar79,auVar79,0xb1);
    auVar79 = vminps_avx(auVar79,auVar62);
    auVar62 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vminps_avx(auVar79,auVar62);
    auVar57 = vminps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar79 = vshufps_avx(auVar72,auVar72,0xb1);
    auVar79 = vminps_avx(auVar72,auVar79);
    auVar72 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vminps_avx(auVar79,auVar72);
    auVar4 = vminps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar4 = vunpcklps_avx(auVar57,auVar4);
    auVar79 = vshufps_avx(auVar65,auVar65,0xb1);
    auVar79 = vminps_avx(auVar65,auVar79);
    auVar72 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vminps_avx(auVar79,auVar72);
    auVar57 = vminps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar57 = vinsertps_avx(auVar4,auVar57,0x28);
    auVar79 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar79 = vmaxps_avx(auVar80,auVar79);
    auVar72 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vmaxps_avx(auVar79,auVar72);
    auVar4 = vmaxps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar79 = vshufps_avx(auVar78,auVar78,0xb1);
    auVar79 = vmaxps_avx(auVar78,auVar79);
    auVar72 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vmaxps_avx(auVar79,auVar72);
    auVar61 = vmaxps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar61 = vunpcklps_avx(auVar4,auVar61);
    auVar79 = vshufps_avx(auVar70,auVar70,0xb1);
    auVar79 = vmaxps_avx(auVar70,auVar79);
    auVar72 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vmaxps_avx(auVar79,auVar72);
    auVar4 = vmaxps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar4 = vinsertps_avx(auVar61,auVar4,0x28);
    auVar79 = vshufps_avx(auVar63,auVar63,0xb1);
    auVar79 = vmaxps_avx(auVar63,auVar79);
    auVar72 = vshufpd_avx(auVar79,auVar79,5);
    auVar79 = vmaxps_avx(auVar79,auVar72);
    auVar61 = vmaxps_avx(auVar79._0_16_,auVar79._16_16_);
    auVar61 = vshufps_avx(auVar61,auVar61,0);
  }
  auVar59 = vminps_avx(auVar57,auVar56);
  auVar4 = vmaxps_avx(auVar4,auVar56);
  auVar57 = vshufps_avx(auVar64,auVar64,0);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  auVar57 = vandps_avx(auVar57,auVar64);
  auVar57 = vmaxps_avx(auVar61,auVar57);
  auVar61 = vsubps_avx(auVar59,auVar57);
  auVar56._0_4_ = auVar4._0_4_ + auVar57._0_4_;
  auVar56._4_4_ = auVar4._4_4_ + auVar57._4_4_;
  auVar56._8_4_ = auVar4._8_4_ + auVar57._8_4_;
  auVar56._12_4_ = auVar4._12_4_ + auVar57._12_4_;
  auVar57 = vandps_avx(auVar61,auVar64);
  auVar4 = vandps_avx(auVar56,auVar64);
  auVar57 = vmaxps_avx(auVar57,auVar4);
  auVar4 = vmovshdup_avx(auVar57);
  auVar4 = vmaxss_avx(auVar4,auVar57);
  auVar57 = vshufpd_avx(auVar57,auVar57,1);
  auVar57 = vmaxss_avx(auVar57,auVar4);
  auVar57 = ZEXT416((uint)(auVar57._0_4_ * 4.7683716e-07));
  auVar57 = vshufps_avx(auVar57,auVar57,0);
  aVar22 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar61,auVar57);
  (__return_storage_ptr__->lower).field_0 = aVar22;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar56._0_4_ + auVar57._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar56._4_4_ + auVar57._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar56._8_4_ + auVar57._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar56._12_4_ + auVar57._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }